

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

void __thiscall
restincurl::SystemException::SystemException(SystemException *this,string *msg,int e)

{
  pointer pcVar1;
  long *plVar2;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_60 [2];
  long local_50 [2];
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  pcVar1 = (msg->_M_dataplus)._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + msg->_M_string_length);
  std::__cxx11::string::append((char *)local_60);
  strerror(e);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_60);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_30 = *plVar3;
    lStack_28 = plVar2[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar3;
    local_40 = (long *)*plVar2;
  }
  local_38 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error((runtime_error *)this,(string *)&local_40);
  *(undefined ***)&this->super_Exception = &PTR__runtime_error_001406b0;
  if (local_40 != &local_30) {
    operator_delete(local_40,local_30 + 1);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  *(undefined ***)&this->super_Exception = &PTR__runtime_error_00140688;
  this->err_ = e;
  return;
}

Assistant:

SystemException(const std::string& msg, const int e) : Exception(msg + " " + strerror(e)), err_{e} {}